

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O0

int Cudd_bddGenConjDecomp(DdManager *dd,DdNode *f,DdNode ***conjuncts)

{
  DdNode **ppDVar1;
  DdNode *local_40;
  DdNode *hlocal;
  DdNode *glocal;
  DdNode ***pppDStack_28;
  int result;
  DdNode ***conjuncts_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  one = dd->one;
  zero = (DdNode *)((ulong)one ^ 1);
  pppDStack_28 = conjuncts;
  conjuncts_local = (DdNode ***)f;
  f_local = &dd->sentinel;
  do {
    *(undefined4 *)&f_local[0xb].next = 0;
    glocal._4_4_ = cuddConjunctsAux((DdManager *)f_local,(DdNode *)conjuncts_local,&hlocal,&local_40
                                   );
  } while (*(int *)&f_local[0xb].next == 1);
  if (glocal._4_4_ == 0) {
    dd_local._4_4_ = 0;
  }
  else if (hlocal == one) {
    Cudd_RecursiveDeref((DdManager *)f_local,hlocal);
    ppDVar1 = (DdNode **)malloc(8);
    *pppDStack_28 = ppDVar1;
    if (*pppDStack_28 == (DdNode **)0x0) {
      Cudd_RecursiveDeref((DdManager *)f_local,local_40);
      *(undefined4 *)((long)&f_local[0xf].type + 8) = 1;
      dd_local._4_4_ = 0;
    }
    else {
      **pppDStack_28 = local_40;
      dd_local._4_4_ = 1;
    }
  }
  else if (local_40 == one) {
    Cudd_RecursiveDeref((DdManager *)f_local,local_40);
    ppDVar1 = (DdNode **)malloc(8);
    *pppDStack_28 = ppDVar1;
    if (*pppDStack_28 == (DdNode **)0x0) {
      Cudd_RecursiveDeref((DdManager *)f_local,hlocal);
      *(undefined4 *)((long)&f_local[0xf].type + 8) = 1;
      dd_local._4_4_ = 0;
    }
    else {
      **pppDStack_28 = hlocal;
      dd_local._4_4_ = 1;
    }
  }
  else {
    ppDVar1 = (DdNode **)malloc(0x10);
    *pppDStack_28 = ppDVar1;
    if (*pppDStack_28 == (DdNode **)0x0) {
      Cudd_RecursiveDeref((DdManager *)f_local,hlocal);
      Cudd_RecursiveDeref((DdManager *)f_local,local_40);
      *(undefined4 *)((long)&f_local[0xf].type + 8) = 1;
      dd_local._4_4_ = 0;
    }
    else {
      **pppDStack_28 = hlocal;
      (*pppDStack_28)[1] = local_40;
      dd_local._4_4_ = 2;
    }
  }
  return dd_local._4_4_;
}

Assistant:

int
Cudd_bddGenConjDecomp(
  DdManager * dd /* manager */,
  DdNode * f /* function to be decomposed */,
  DdNode *** conjuncts /* address of the array of conjuncts */)
{
    int result;
    DdNode *glocal, *hlocal;

    one = DD_ONE(dd);
    zero = Cudd_Not(one);
    
    do {
        dd->reordered = 0;
        result = cuddConjunctsAux(dd, f, &glocal, &hlocal);
    } while (dd->reordered == 1);

    if (result == 0) {
        return(0);
    }

    if (glocal != one) {
        if (hlocal != one) {
            *conjuncts = ABC_ALLOC(DdNode *,2);
            if (*conjuncts == NULL) {
                Cudd_RecursiveDeref(dd,glocal);
                Cudd_RecursiveDeref(dd,hlocal);
                dd->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            (*conjuncts)[0] = glocal;
            (*conjuncts)[1] = hlocal;
            return(2);
        } else {
            Cudd_RecursiveDeref(dd,hlocal);
            *conjuncts = ABC_ALLOC(DdNode *,1);
            if (*conjuncts == NULL) {
                Cudd_RecursiveDeref(dd,glocal);
                dd->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            (*conjuncts)[0] = glocal;
            return(1);
        }
    } else {
        Cudd_RecursiveDeref(dd,glocal);
        *conjuncts = ABC_ALLOC(DdNode *,1);
        if (*conjuncts == NULL) {
            Cudd_RecursiveDeref(dd,hlocal);
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        (*conjuncts)[0] = hlocal;
        return(1);
    }

}